

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QIconModeViewBase::appendHiddenRow(QIconModeViewBase *this,int row)

{
  long lVar1;
  QListViewItem *this_00;
  qsizetype qVar2;
  int in_ESI;
  QBspTree *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  qsizetype in_stack_ffffffffffffffb8;
  QList<int> **this_01;
  undefined1 in_stack_ffffffffffffffe8 [16];
  undefined1 auVar4 [12];
  int i;
  
  auVar4 = in_stack_ffffffffffffffe8._4_12_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < in_ESI) {
    this_00 = (QListViewItem *)(long)in_ESI;
    qVar2 = QList<QListViewItem>::size((QList<QListViewItem> *)&in_RDI[1].leaves.d.ptr);
    if ((long)this_00 < qVar2) {
      this_01 = &(in_RDI->leaves).d.ptr;
      QList<QListViewItem>::at((QList<QListViewItem> *)this_01,in_stack_ffffffffffffffb8);
      i = (int)((ulong)this_01 >> 0x20);
      QVar3 = QListViewItem::rect(this_00);
      auVar4 = QVar3._4_12_;
      QBspTree::removeLeaf(in_RDI,(QRect *)this_00,i);
    }
  }
  QCommonListViewBase::appendHiddenRow(auVar4._4_8_,auVar4._0_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::appendHiddenRow(int row)
{
    if (row >= 0 && row < items.size()) //remove item
        tree.removeLeaf(items.at(row).rect(), row);
    QCommonListViewBase::appendHiddenRow(row);
}